

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_set.hpp
# Opt level: O2

set<char,_std::less<char>,_std::allocator<char>_> * __thiscall
burst::make_set<char,std::forward_list<char,std::allocator<char>>const&>
          (set<char,_std::less<char>,_std::allocator<char>_> *__return_storage_ptr__,burst *this,
          forward_list<char,_std::allocator<char>_> *values)

{
  std::set<char,std::less<char>,std::allocator<char>>::set<std::_Fwd_list_const_iterator<char>>
            ((set<char,std::less<char>,std::allocator<char>> *)__return_storage_ptr__,
             *(_Fwd_list_node_base **)this,(_Fwd_list_const_iterator<char>)0x0);
  return __return_storage_ptr__;
}

Assistant:

auto make_set (InputRange && values)
    {
        using std::begin;
        using std::end;
        return
            std::set<Value>
            (
                begin(std::forward<InputRange>(values)),
                end(std::forward<InputRange>(values))
            );
    }